

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.h
# Opt level: O0

void __thiscall
btConeTwistConstraint::setLimit
          (btConeTwistConstraint *this,btScalar _swingSpan1,btScalar _swingSpan2,btScalar _twistSpan
          ,btScalar _softness,btScalar _biasFactor,btScalar _relaxationFactor)

{
  btScalar _relaxationFactor_local;
  btScalar _biasFactor_local;
  btScalar _softness_local;
  btScalar _twistSpan_local;
  btScalar _swingSpan2_local;
  btScalar _swingSpan1_local;
  btConeTwistConstraint *this_local;
  
  this->m_swingSpan1 = _swingSpan1;
  this->m_swingSpan2 = _swingSpan2;
  this->m_twistSpan = _twistSpan;
  this->m_limitSoftness = _softness;
  this->m_biasFactor = _biasFactor;
  this->m_relaxationFactor = _relaxationFactor;
  return;
}

Assistant:

void	setLimit(btScalar _swingSpan1,btScalar _swingSpan2,btScalar _twistSpan, btScalar _softness = 1.f, btScalar _biasFactor = 0.3f, btScalar _relaxationFactor = 1.0f)
	{
		m_swingSpan1 = _swingSpan1;
		m_swingSpan2 = _swingSpan2;
		m_twistSpan  = _twistSpan;

		m_limitSoftness =  _softness;
		m_biasFactor = _biasFactor;
		m_relaxationFactor = _relaxationFactor;
	}